

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void sort_rooms(level *lev,int levstyle)

{
  mkroom *__src;
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [12];
  unkbyte10 Var5;
  undefined1 auVar6 [12];
  void *__dest;
  void *__dest_00;
  void *__base;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  mkroom *pmVar11;
  ulong uVar12;
  code *__compar;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar22 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined2 uVar25;
  
  iVar10 = lev->nroom;
  if (0 < iVar10) {
    __compar = sort_rooms_standard_comp;
    switch(levstyle) {
    case 0:
    case 1:
    case 3:
      break;
    case 2:
      __compar = sort_rooms_ring_comp;
      break;
    case 4:
      goto switchD_001ccb3f_caseD_4;
    default:
      warning("sort_rooms: unknown levstyle %d");
      iVar10 = lev->nroom;
    }
    __dest = xmalloc(iVar10 * 0xd8);
    __src = lev->rooms;
    memcpy(__dest,__src,(long)lev->nroom * 0xd8);
    uVar12 = 0;
    if (lev->doorindex < 1) {
      __dest_00 = (void *)0x0;
    }
    else {
      __dest_00 = xmalloc(lev->doorindex * 2);
      memcpy(__dest_00,lev->doors,(long)lev->doorindex * 2);
    }
    __base = xmalloc(lev->nroom * 0x14);
    uVar2 = lev->nroom;
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    piVar7 = (int *)((long)__base + 4);
    pmVar11 = __src;
    for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      piVar7[-1] = (int)uVar12;
      uVar1._0_1_ = pmVar11->lx;
      uVar1._1_1_ = pmVar11->hx;
      uVar1._2_1_ = pmVar11->ly;
      uVar1._3_1_ = pmVar11->hy;
      uVar1._4_1_ = pmVar11->rtype;
      uVar1._5_1_ = pmVar11->rlit;
      uVar1._6_1_ = pmVar11->needfill;
      uVar1._7_1_ = pmVar11->doorct;
      auVar21._8_6_ = 0;
      auVar21._0_8_ = uVar1;
      auVar21[0xe] = uVar1._7_1_;
      auVar21[0xf] = uVar1._7_1_;
      auVar20._14_2_ = auVar21._14_2_;
      auVar20._8_5_ = 0;
      auVar20._0_8_ = uVar1;
      auVar20[0xd] = uVar1._6_1_;
      auVar19._13_3_ = auVar20._13_3_;
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar1;
      auVar19[0xc] = uVar1._6_1_;
      auVar18._12_4_ = auVar19._12_4_;
      auVar18._8_3_ = 0;
      auVar18._0_8_ = uVar1;
      auVar18[0xb] = uVar1._5_1_;
      auVar17._11_5_ = auVar18._11_5_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar1;
      auVar17[10] = uVar1._5_1_;
      auVar16._10_6_ = auVar17._10_6_;
      auVar16[8] = 0;
      auVar16._0_8_ = uVar1;
      auVar16[9] = uVar1._4_1_;
      auVar15._9_7_ = auVar16._9_7_;
      auVar15[8] = uVar1._4_1_;
      auVar15._0_8_ = uVar1;
      Var5 = CONCAT91(CONCAT81(auVar15._8_8_,uVar1._3_1_),uVar1._3_1_);
      auVar4._2_10_ = Var5;
      auVar4[1] = uVar1._2_1_;
      auVar4[0] = uVar1._2_1_;
      auVar3._2_12_ = auVar4;
      auVar3[1] = uVar1._1_1_;
      auVar3[0] = uVar1._1_1_;
      auVar14._0_2_ = CONCAT11((undefined1)uVar1,(undefined1)uVar1);
      auVar14._2_14_ = auVar3;
      uVar25 = (undefined2)Var5;
      auVar24._0_12_ = auVar14._0_12_;
      auVar24._12_2_ = uVar25;
      auVar24._14_2_ = uVar25;
      auVar23._12_4_ = auVar24._12_4_;
      auVar23._0_10_ = auVar14._0_10_;
      auVar23._10_2_ = auVar4._0_2_;
      auVar22._10_6_ = auVar23._10_6_;
      auVar22._0_8_ = auVar14._0_8_;
      auVar22._8_2_ = auVar4._0_2_;
      auVar6._4_8_ = auVar22._8_8_;
      auVar6._2_2_ = auVar3._0_2_;
      auVar6._0_2_ = auVar3._0_2_;
      *piVar7 = (int)auVar14._0_2_ >> 8;
      piVar7[1] = auVar22._8_4_ >> 0x18;
      piVar7[2] = auVar6._0_4_ >> 0x18;
      piVar7[3] = auVar23._12_4_ >> 0x18;
      pmVar11 = pmVar11 + 1;
      piVar7 = piVar7 + 5;
    }
    qsort(__base,(long)(int)uVar2,0x14,__compar);
    iVar10 = 0;
    for (lVar13 = 0; lVar13 < lev->nroom; lVar13 = lVar13 + 1) {
      pmVar11 = __src + lVar13;
      memcpy(pmVar11,(void *)((long)*(int *)((long)__base + lVar13 * 0x14) * 0xd8 + (long)__dest),
             0xd8);
      if (__dest_00 != (void *)0x0) {
        for (lVar9 = 0; lVar9 < pmVar11->doorct; lVar9 = lVar9 + 1) {
          lev->doors[iVar10 + lVar9] = *(coord *)((long)__dest_00 + (pmVar11->fdoor + lVar9) * 2);
        }
        pmVar11->fdoor = (schar)iVar10;
        iVar10 = pmVar11->doorct + iVar10;
      }
    }
  }
switchD_001ccb3f_caseD_4:
  return;
}

Assistant:

void sort_rooms(struct level *lev, int levstyle)
{
	struct mkroom *tmprooms;
	coord *tmpdoors;
	struct sort_rooms_data *sortable;
	int (*sort_func)(const void *, const void *);
	int i, j, new_door_index;

	if (lev->nroom < 1) return;

	/* required for corridors of some level styles */
	switch (levstyle) {
	default:
	    warning("sort_rooms: unknown levstyle %d", levstyle);
	    /* fall through */
	case LEVSTYLE_STANDARD:
	case LEVSTYLE_ANYTOANY:
	case LEVSTYLE_HUB:
	    sort_func = sort_rooms_standard_comp;
	    break;
	case LEVSTYLE_RING:
	    sort_func = sort_rooms_ring_comp;
	    break;
	case LEVSTYLE_GRID:
	    /* no sorting */
	    return;
	}

	/* save rooms and doors in their original order */
	tmprooms = xmalloc(lev->nroom * sizeof(struct mkroom));
	memcpy(tmprooms, lev->rooms, lev->nroom * sizeof(struct mkroom));
	if (lev->doorindex > 0) {
		tmpdoors = xmalloc(lev->doorindex * sizeof(coord));
		memcpy(tmpdoors, lev->doors, lev->doorindex * sizeof(coord));
	} else {
		tmpdoors = NULL;
	}

	/* sort rooms from left to right */
	sortable = xmalloc(lev->nroom * sizeof(struct sort_rooms_data));
	for (i = 0; i < lev->nroom; i++) {
		sortable[i].room_index = i;
		sortable[i].lx = lev->rooms[i].lx;
		sortable[i].ly = lev->rooms[i].ly;
		sortable[i].hx = lev->rooms[i].hx;
		sortable[i].hy = lev->rooms[i].hy;
	}
	qsort(sortable, lev->nroom, sizeof(struct sort_rooms_data), sort_func);

	/* apply room sorting */
	new_door_index = 0;
	for (i = 0; i < lev->nroom; i++) {
		struct mkroom *room;
		lev->rooms[i] = tmprooms[sortable[i].room_index];
		room = &lev->rooms[i];

		/* reorder doors to match sorted room order */
		if (!tmpdoors) continue;
		for (j = 0; j < room->doorct; j++)
			lev->doors[new_door_index + j] = tmpdoors[room->fdoor + j];
		room->fdoor = new_door_index;
		new_door_index += room->doorct;
	}
}